

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream(cmGeneratedFileStream *this,Encoding encoding)

{
  codecvt *this_00;
  locale local_40;
  locale local_38;
  locale local_30 [3];
  Encoding local_14;
  cmGeneratedFileStream *pcStack_10;
  Encoding encoding_local;
  cmGeneratedFileStream *this_local;
  
  local_14 = encoding;
  pcStack_10 = this;
  std::ios::ios((ios *)&(this->super_ofstream).field_0x160);
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  std::ofstream::ofstream(this);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_01102ee8;
  *(undefined ***)&(this->super_ofstream).field_0x160 = &PTR__cmGeneratedFileStream_01102f10;
  if (local_14 != None) {
    std::ios_base::getloc((ios_base *)&local_40);
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,local_14);
    std::locale::locale<codecvt>(&local_38,&local_40,this_00);
    std::ios::imbue(local_30);
    std::locale::~locale(local_30);
    std::locale::~locale(&local_38);
    std::locale::~locale(&local_40);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(Encoding encoding)
{
#ifndef CMAKE_BOOTSTRAP
  if (encoding != codecvt::None) {
    this->imbue(std::locale(this->getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
}